

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyVertices
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  qreal *this_00;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar1;
  AnchorData **ppAVar2;
  undefined8 *puVar3;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *pGVar4;
  QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair*> *this_01;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *pGVar5;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *pGVar6;
  QGraphicsLayoutItem *pQVar7;
  bool bVar8;
  bool bVar9;
  iterator iVar10;
  AnchorData *pAVar11;
  undefined7 uVar14;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar12;
  AnchorData *newV;
  iterator iVar13;
  byte bVar15;
  undefined1 *puVar16;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *pGVar17;
  ulong uVar18;
  AnchorData *vertex;
  AnchorData **ppAVar19;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar20;
  long lVar21;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_02;
  long in_FS_OFFSET;
  AnchorVertex *next;
  bool local_105;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_c0;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_a8;
  AnchorData *local_90;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_88;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_70;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_68;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  local_48;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  lVar21 = (long)(int)orientation;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (AnchorVertex **)0x0;
  local_68.d.size = 0;
  local_88.d.d = (Data *)(this->graph).m_data[lVar21 + 1].m_graph.d;
  QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
  emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
            ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_68,0,
             (AnchorVertex **)&local_88);
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(&local_68);
  local_70.d = (Data *)0x0;
  local_105 = local_68.d.size == 0;
  if (!local_105) {
    this_02 = (this->graph).m_data + lVar21 + -1;
    pGVar4 = (this->graph).m_data + lVar21 + 1;
    this_01 = (QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair*> *)
              ((long)&this->layoutCentralVertex + lVar21 * 0x18 + 8);
    pGVar5 = (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
             ((this->layoutFirstVertex).m_data + lVar21 + 1);
    pGVar6 = (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
             ((this->layoutCentralVertex).m_data + lVar21 + 1);
    do {
      iVar10 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(&local_68);
      vertex = (AnchorData *)iVar10.i[-1];
      local_68.d.size = local_68.d.size + -1;
      local_88.d.d = (Data *)vertex;
      QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue> *)&local_70,
                 (AnchorVertex **)&local_88,(QHashDummyValue *)&local_a8);
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_88,this_02,(AnchorVertex *)vertex);
      if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
        puVar16 = (undefined1 *)0x0;
        do {
          local_90 = (AnchorData *)local_88.d.ptr[(long)puVar16];
          pAVar11 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                    ::edgeData(this_02,(AnchorVertex *)vertex,(AnchorVertex *)local_90);
          if ((QGraphicsLayoutItem *)(vertex->super_QSimplexVariable).result == pQVar7) {
            bVar8 = (QGraphicsLayoutItem *)(local_90->super_QSimplexVariable).result == pQVar7;
            uVar14 = (undefined7)((ulong)local_90 >> 8);
          }
          else {
            bVar8 = false;
            uVar14 = 0;
          }
          bVar15 = 1;
          if ((pAVar11->minSize == 0.0) && (!NAN(pAVar11->minSize))) {
            bVar15 = -(pAVar11->maxSize != 0.0) & 1;
          }
          pNVar12 = (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                    CONCAT71(uVar14,bVar8 | bVar15);
          if ((bVar8 | bVar15) == 0) {
            newV = (AnchorData *)operator_new(0x68);
            (newV->super_QSimplexVariable).result = 0.0;
            (newV->super_QSimplexVariable).index = AnchorLeft;
            newV->_vptr_AnchorData = (_func_int **)&PTR__AnchorVertexPair_0081f288;
            newV->to = (AnchorVertex *)vertex;
            newV->minSize = (qreal)local_90;
            newV->prefSize = (qreal)pAVar11;
            this_00 = &newV->maxSize;
            newV->sizeAtPreferred = 0.0;
            newV->sizeAtMaximum = 0.0;
            newV->maxPrefSize = 0.0;
            newV->sizeAtMinimum = 0.0;
            newV->maxSize = 0.0;
            newV->minPrefSize = 0.0;
            local_a8.d.d = (Data *)newV;
            QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertexPair*>::
            emplace<QtGraphicsAnchorLayout::AnchorVertexPair*&>
                      (this_01,*(qsizetype *)(this_01 + 0x10),(AnchorVertexPair **)&local_a8);
            QList<QtGraphicsAnchorLayout::AnchorVertexPair_*>::end
                      ((QList<QtGraphicsAnchorLayout::AnchorVertexPair_*> *)this_01);
            Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
            adjacentVertices(&local_a8,this_02,(AnchorVertex *)vertex);
            Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
            adjacentVertices(&local_c0,this_02,(AnchorVertex *)local_90);
            if (local_a8.d.size != 0) {
              uVar18 = 0;
              do {
                if ((AnchorData *)local_a8.d.ptr[uVar18] != local_90) {
                  local_48.d = (Data *)Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                                       ::edgeData(this_02,(AnchorVertex *)vertex,
                                                  local_a8.d.ptr[uVar18]);
                  QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
                  emplace<QtGraphicsAnchorLayout::AnchorData*&>
                            ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)this_00,
                             (qsizetype)newV->maxPrefSize,(AnchorData **)&local_48);
                  QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                            ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)this_00);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < (ulong)local_a8.d.size);
            }
            if (local_c0.d.size != 0) {
              uVar18 = 0;
              do {
                pAVar11 = (AnchorData *)local_c0.d.ptr[uVar18];
                if (pAVar11 != vertex) {
                  local_48.d = (Data *)Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                                       ::edgeData(this_02,(AnchorVertex *)local_90,
                                                  (AnchorVertex *)pAVar11);
                  QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
                  emplace<QtGraphicsAnchorLayout::AnchorData*&>
                            ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)
                             &newV->sizeAtMinimum,(qsizetype)newV->sizeAtMaximum,
                             (AnchorData **)&local_48);
                  iVar13 = QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                                     ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)
                                      &newV->sizeAtMinimum);
                  if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
LAB_005cb035:
                    iVar13.i = (AnchorData **)0xffffffffffffffff;
                  }
                  else {
                    ppAVar19 = (AnchorData **)0xfffffffffffffff8;
                    do {
                      ppAVar2 = ppAVar19 + -local_88.d.size;
                      if (ppAVar2 == (AnchorData **)0xfffffffffffffff8) goto LAB_005cb02f;
                      iVar13.i = ppAVar19 + 1;
                      puVar3 = (undefined8 *)((long)(local_88.d.ptr + 1) + (long)ppAVar19);
                      ppAVar19 = iVar13.i;
                    } while ((AnchorData *)*puVar3 != pAVar11);
                    iVar13.i = iVar13.i >> 3;
LAB_005cb02f:
                    if (ppAVar2 == (AnchorData **)0xfffffffffffffff8) goto LAB_005cb035;
                  }
                  if (iVar13.i == (AnchorData **)0xffffffffffffffff) {
                    local_48.d = (Data *)pAVar11;
                    QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
                    emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                              ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_88,
                               local_88.d.size,(AnchorVertex **)&local_48);
                    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(&local_88);
                  }
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < (ulong)local_c0.d.size);
            }
            bVar8 = replaceVertex(this,orientation,(AnchorVertex *)vertex,(AnchorVertex *)newV,
                                  (QList<QtGraphicsAnchorLayout::AnchorData_*> *)this_00);
            bVar9 = replaceVertex(this,orientation,(AnchorVertex *)local_90,(AnchorVertex *)newV,
                                  (QList<QtGraphicsAnchorLayout::AnchorData_*> *)
                                  &newV->sizeAtMinimum);
            pAVar11 = vertex;
            if (((QGraphicsLayoutItem *)(vertex->super_QSimplexVariable).result != pQVar7) &&
               (pAVar11 = local_90,
               (QGraphicsLayoutItem *)(local_90->super_QSimplexVariable).result != pQVar7)) {
              pAVar11 = (AnchorData *)0x0;
            }
            if ((pAVar11 != (AnchorData *)0x0) &&
               ((((newV->super_QSimplexVariable).result = (qreal)pQVar7, pGVar17 = pGVar4,
                 (AnchorData *)(pGVar4->m_graph).d == pAVar11 ||
                 (pGVar17 = pGVar5, (AnchorData *)(pGVar5->m_graph).d == pAVar11)) ||
                (pGVar17 = pGVar6, (AnchorData *)(pGVar6->m_graph).d == pAVar11)))) {
              (pGVar17->m_graph).d = (Data *)newV;
            }
            Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
            takeEdge(this_02,(AnchorVertex *)vertex,(AnchorVertex *)local_90);
            if (!bVar8 || !bVar9) {
              if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,8,0x10);
                }
              }
              if ((AnchorData *)local_a8.d.d != (AnchorData *)0x0) {
                LOCK();
                *(int *)&(local_a8.d.d)->super_QArrayData =
                     *(int *)&(local_a8.d.d)->super_QArrayData + -1;
                UNLOCK();
                if (*(int *)&(local_a8.d.d)->super_QArrayData == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,8,0x10);
                }
              }
              if ((Data *)local_88.d.d != (Data *)0x0) {
                LOCK();
                (((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.
                super___atomic_base<int>._M_i =
                     (((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,8,0x10);
                }
              }
              goto LAB_005cb256;
            }
            local_48.d = (Data *)newV;
            QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::emplace<QHashDummyValue>
                      (&local_70,(AnchorVertex **)&local_48,&local_39);
            if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,8,0x10);
              }
            }
            vertex = newV;
            if ((AnchorData *)local_a8.d.d != (AnchorData *)0x0) {
              LOCK();
              *(int *)&(local_a8.d.d)->super_QArrayData =
                   *(int *)&(local_a8.d.d)->super_QArrayData + -1;
              UNLOCK();
              if (*(int *)&(local_a8.d.d)->super_QArrayData == 0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,8,0x10);
              }
            }
          }
          else if ((local_70.d == (Data *)0x0) ||
                  (pNVar12 = QHashPrivate::
                             Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                             ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                                       ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                         *)local_70.d,(AnchorVertex **)&local_90),
                  pNVar12 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0))
          {
            if (local_68.d.size == 0) {
LAB_005cae6d:
              pNVar12 = (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                        0xffffffffffffffff;
            }
            else {
              pNVar20 = (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                        0xfffffffffffffff8;
              do {
                pNVar1 = pNVar20 + -local_68.d.size;
                if (pNVar1 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                              0xfffffffffffffff8) goto LAB_005cae67;
                pNVar12 = pNVar20 + 1;
                puVar3 = (undefined8 *)((long)(local_68.d.ptr + 1) + (long)pNVar20);
                pNVar20 = pNVar12;
              } while ((AnchorData *)*puVar3 != local_90);
              pNVar12 = (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                        ((long)pNVar12 >> 3);
LAB_005cae67:
              if (pNVar1 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)
                            0xfffffffffffffff8) goto LAB_005cae6d;
            }
            if (pNVar12 ==
                (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0xffffffffffffffff)
            {
              local_a8.d.d = (Data *)local_90;
              QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
              emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                        ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_68,
                         local_68.d.size,(AnchorVertex **)&local_a8);
              QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(&local_68);
            }
          }
          puVar16 = puVar16 + 1;
        } while (puVar16 < (ulong)local_88.d.size);
      }
      if ((Data *)local_88.d.d != (Data *)0x0) {
        LOCK();
        (((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.super___atomic_base<int>.
        _M_i = (((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((RefCount *)&(local_88.d.d)->super_QArrayData)->atomic)._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,8,0x10);
        }
      }
      local_105 = local_68.d.size == 0;
    } while (!local_105);
  }
LAB_005cb256:
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_70);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_105;
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyVertices(Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    // We'll walk through vertices
    QStack<AnchorVertex *> stack;
    stack.push(layoutFirstVertex[orientation]);
    QSet<AnchorVertex *> visited;

    while (!stack.isEmpty()) {
        AnchorVertex *v = stack.pop();
        visited.insert(v);

        // Each adjacent of 'v' is a possible vertex to be merged. So we traverse all of
        // them. Since once a merge is made, we might add new adjacents, and we don't want to
        // pass two times through one adjacent. The 'index' is used to track our position.
        QList<AnchorVertex *> adjacents = g.adjacentVertices(v);
        int index = 0;

        while (index < adjacents.size()) {
            AnchorVertex *next = adjacents.at(index);
            index++;

            AnchorData *data = g.edgeData(v, next);
            const bool bothLayoutVertices = v->m_item == q && next->m_item == q;
            const bool zeroSized = !data->minSize && !data->maxSize;

            if (!bothLayoutVertices && zeroSized) {

                // Create a new vertex pair, note that we keep a list of those vertices so we can
                // easily process them when restoring the graph.
                AnchorVertexPair *newV = new AnchorVertexPair(v, next, data);
                simplifiedVertices[orientation].append(newV);

                // Collect the anchors of both vertices, the new vertex pair will take their place
                // in those anchors
                const QList<AnchorVertex *> &vAdjacents = g.adjacentVertices(v);
                const QList<AnchorVertex *> &nextAdjacents = g.adjacentVertices(next);

                for (int i = 0; i < vAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = vAdjacents.at(i);
                    if (adjacent != next) {
                        AnchorData *ad = g.edgeData(v, adjacent);
                        newV->m_firstAnchors.append(ad);
                    }
                }

                for (int i = 0; i < nextAdjacents.size(); ++i) {
                    AnchorVertex *adjacent = nextAdjacents.at(i);
                    if (adjacent != v) {
                        AnchorData *ad = g.edgeData(next, adjacent);
                        newV->m_secondAnchors.append(ad);

                        // We'll also add new vertices to the adjacent list of the new 'v', to be
                        // created as a vertex pair and replace the current one.
                        if (!adjacents.contains(adjacent))
                            adjacents.append(adjacent);
                    }
                }

                // ### merge this loop into the ones that calculated m_firstAnchors/m_secondAnchors?
                // Make newV take the place of v and next
                bool feasible = replaceVertex(orientation, v, newV, newV->m_firstAnchors);
                feasible &= replaceVertex(orientation, next, newV, newV->m_secondAnchors);

                // Update the layout vertex information if one of the vertices is a layout vertex.
                AnchorVertex *layoutVertex = nullptr;
                if (v->m_item == q)
                    layoutVertex = v;
                else if (next->m_item == q)
                    layoutVertex = next;

                if (layoutVertex) {
                    // Layout vertices always have m_item == q...
                    newV->m_item = q;
                    changeLayoutVertex(orientation, layoutVertex, newV);
                }

                g.takeEdge(v, next);

                // If a non-feasibility is found, we leave early and cancel the simplification
                if (!feasible)
                    return false;

                v = newV;
                visited.insert(newV);

            } else if (!visited.contains(next) && !stack.contains(next)) {
                // If the adjacent is not fit for merge and it wasn't visited by the outermost
                // loop, we add it to the stack.
                stack.push(next);
            }
        }
    }

    return true;
}